

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::ast::Type_const*>::emplaceRealloc<slang::ast::Type_const*>
          (SmallVectorBase<slang::ast::Type_const*> *this,pointer pos,Type **args)

{
  size_type sVar1;
  size_type sVar2;
  size_type capacity;
  iterator ppTVar3;
  Type **__result;
  Type **ppTVar4;
  EVP_PKEY_CTX *ctx;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  Type **args_local;
  pointer pos_local;
  SmallVectorBase<const_slang::ast::Type_*> *this_local;
  
  sVar1 = *(size_type *)(this + 8);
  sVar2 = SmallVectorBase<const_slang::ast::Type_*>::max_size
                    ((SmallVectorBase<const_slang::ast::Type_*> *)this);
  if (sVar1 == sVar2) {
    slang::detail::throwLengthError();
  }
  capacity = SmallVectorBase<const_slang::ast::Type_*>::calculateGrowth
                       ((SmallVectorBase<const_slang::ast::Type_*> *)this,*(long *)(this + 8) + 1);
  ppTVar3 = SmallVectorBase<const_slang::ast::Type_*>::begin
                      ((SmallVectorBase<const_slang::ast::Type_*> *)this);
  __result = (Type **)slang::detail::allocArray(capacity,8);
  ppTVar4 = __result + ((long)pos - (long)ppTVar3 >> 3);
  *ppTVar4 = *args;
  ppTVar3 = SmallVectorBase<const_slang::ast::Type_*>::end
                      ((SmallVectorBase<const_slang::ast::Type_*> *)this);
  if (pos == ppTVar3) {
    ppTVar3 = SmallVectorBase<const_slang::ast::Type_*>::begin
                        ((SmallVectorBase<const_slang::ast::Type_*> *)this);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<const_slang::ast::Type_*>::end
                    ((SmallVectorBase<const_slang::ast::Type_*> *)this);
    std::uninitialized_move<slang::ast::Type_const**,slang::ast::Type_const**>
              (ppTVar3,(Type **)ctx,__result);
  }
  else {
    ppTVar3 = SmallVectorBase<const_slang::ast::Type_*>::begin
                        ((SmallVectorBase<const_slang::ast::Type_*> *)this);
    std::uninitialized_move<slang::ast::Type_const**,slang::ast::Type_const**>(ppTVar3,pos,__result)
    ;
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<const_slang::ast::Type_*>::end
                    ((SmallVectorBase<const_slang::ast::Type_*> *)this);
    std::uninitialized_move<slang::ast::Type_const**,slang::ast::Type_const**>
              (pos,(Type **)ctx,ppTVar4 + 1);
  }
  SmallVectorBase<const_slang::ast::Type_*>::cleanup
            ((SmallVectorBase<const_slang::ast::Type_*> *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(size_type *)(this + 0x10) = capacity;
  *(Type ***)this = __result;
  return ppTVar4;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}